

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O1

Pattern * __thiscall
trieste::In<trieste::TokenDef,trieste::TokenDef,trieste::TokenDef,trieste::TokenDef>
          (Pattern *__return_storage_ptr__,trieste *this,Token *type1,TokenDef *types,
          TokenDef *types_1,TokenDef *types_2,TokenDef *types_3)

{
  undefined8 uVar1;
  Pattern *pPVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  initializer_list<trieste::Token> __l;
  allocator_type local_10a;
  less<trieste::Token> local_109;
  PatternPtr local_108;
  Pattern *local_f8;
  _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
  local_f0;
  FastPattern local_c0;
  Token local_58;
  Token *local_50;
  TokenDef *local_48;
  TokenDef *local_40;
  TokenDef *local_38;
  
  uVar1 = *(undefined8 *)this;
  local_f8 = __return_storage_ptr__;
  local_108.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  (local_108.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi)->_M_use_count = 1;
  (local_108.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi)->_M_weak_count = 1;
  (local_108.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002a8508;
  local_108.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_108.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi + 1);
  local_108.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi[1]._M_use_count = 0;
  local_108.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi[1]._M_weak_count = 0;
  local_108.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_108.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__PatternDef_002a8558;
  local_108.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi[2]._M_use_count = (int)uVar1;
  local_108.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi[2]._M_weak_count = (int)((ulong)uVar1 >> 0x20);
  local_108.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi[3]._vptr__Sp_counted_base = (_func_int **)type1;
  *(TokenDef **)
   &local_108.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[3]._M_use_count = types;
  local_108.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi[4]._vptr__Sp_counted_base = (_func_int **)types_1;
  *(TokenDef **)
   &local_108.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[4]._M_use_count = types_2;
  local_58.def = *(TokenDef **)this;
  __l._M_len = 5;
  __l._M_array = &local_58;
  local_50 = type1;
  local_48 = types;
  local_40 = types_1;
  local_38 = types_2;
  std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::set
            ((set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
             &local_f0,__l,&local_109,&local_10a);
  detail::FastPattern::match_parent
            (&local_c0,
             (set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
             &local_f0);
  pPVar2 = local_f8;
  detail::Pattern::Pattern(local_f8,&local_108,&local_c0);
  CLI::std::
  _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
  ::~_Rb_tree(&local_c0.parents._M_t);
  CLI::std::
  _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
  ::~_Rb_tree((_Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
               *)&local_c0);
  CLI::std::
  _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
  ::~_Rb_tree(&local_f0);
  if (local_108.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return pPVar2;
}

Assistant:

inline detail::Pattern In(const Token& type1, const Ts&... types)
  {
    std::array<Token, 1 + sizeof...(types)> types_ = {type1, types...};
    return detail::Pattern(
      std::make_shared<detail::Inside<1 + sizeof...(types)>>(types_),
      detail::FastPattern::match_parent({type1, types...}));
  }